

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

int64_t upb_Message_GetInt64(upb_Message *msg,upb_MiniTableField *f,int64_t default_val)

{
  upb_CType uVar1;
  upb_MessageValue uVar2;
  
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 != kUpb_CType_Int64) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int64",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x19b,
                  "int64_t upb_Message_GetInt64(const struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  uVar2._8_8_ = (ulong)f->mode_dont_copy_me__upb_internal_use_only & 0xffffffffffffff03;
  if ((char)uVar2._8_8_ == '\x02') {
    if (0xbf < f->mode_dont_copy_me__upb_internal_use_only) {
      uVar2.int64_val = default_val;
      uVar2 = upb_Message_GetField(msg,f,uVar2);
      return (int64_t)uVar2.double_val;
    }
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x19d,
                  "int64_t upb_Message_GetInt64(const struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  __assert_fail("upb_MiniTableField_IsScalar(f)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x19c,
                "int64_t upb_Message_GetInt64(const struct upb_Message *, const upb_MiniTableField *, int64_t)"
               );
}

Assistant:

UPB_API_INLINE int64_t upb_Message_GetInt64(const struct upb_Message* msg,
                                            const upb_MiniTableField* f,
                                            int64_t default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int64);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_8Byte);

  upb_MessageValue def;
  def.int64_val = default_val;
  return upb_Message_GetField(msg, f, def).int64_val;
}